

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O2

wchar_t valid_options_item(menu *menu,wchar_t oid)

{
  wchar_t wVar1;
  
  if ((uint)oid < 0x11) {
    return L'\x01';
  }
  wVar1 = L'\0';
  if (oid != L'\x11') {
    wVar1 = (wchar_t)((long)oid - 0x12U < 3);
  }
  return wVar1;
}

Assistant:

static int valid_options_item(struct menu *menu, int oid)
{
	size_t line = (size_t) oid;

	if (line < N_ELEMENTS(sval_dependent))
		return 1;

	/* Separator - blank line. */
	if (line == N_ELEMENTS(sval_dependent))
		return 0;

	line = line - N_ELEMENTS(sval_dependent) - 1;

	if (line < N_ELEMENTS(extra_item_options))
		return 1;

	return 0;
}